

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.c
# Opt level: O2

LY_ERR lyplg_type_compare_binary(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  size_t __n;
  int iVar1;
  LY_ERR LVar2;
  
  __n = *(size_t *)((long)&val1->field_2 + 8);
  if (__n == *(size_t *)((long)&val2->field_2 + 8)) {
    iVar1 = bcmp((val1->field_2).dyn_mem,(val2->field_2).dyn_mem,__n);
    LVar2 = LY_ENOT;
    if (iVar1 == 0) {
      LVar2 = LY_SUCCESS;
    }
    return LVar2;
  }
  return LY_ENOT;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_compare_binary(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1, const struct lyd_value *val2)
{
    struct lyd_value_binary *v1, *v2;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    if ((v1->size != v2->size) || memcmp(v1->data, v2->data, v1->size)) {
        return LY_ENOT;
    }
    return LY_SUCCESS;
}